

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O0

ItemFlags __thiscall QtPrivate::QCalendarModel::flags(QCalendarModel *this,QModelIndex *index)

{
  bool bVar1;
  int row;
  QCalendarModel *in_RSI;
  QModelIndex *in_RDI;
  long in_FS_OFFSET;
  QDate date;
  QDate *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int in_stack_ffffffffffffffd0;
  QFlagsStorageHelper<Qt::ItemFlag,_4> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  row = QModelIndex::row((QModelIndex *)in_RSI);
  QModelIndex::column((QModelIndex *)in_RSI);
  dateForCell(in_RSI,row,in_stack_ffffffffffffffd0);
  bVar1 = QDate::isValid((QDate *)CONCAT44(row,in_stack_ffffffffffffffd0));
  if (bVar1) {
    bVar1 = ::operator<((QDate *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffb8);
    if (bVar1) {
      memset(&local_c,0,4);
      QFlags<Qt::ItemFlag>::QFlags((QFlags<Qt::ItemFlag> *)0x51966a);
    }
    else {
      bVar1 = operator>((QDate *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffb8);
      if (bVar1) {
        memset(&local_c,0,4);
        QFlags<Qt::ItemFlag>::QFlags((QFlags<Qt::ItemFlag> *)0x5196a0);
      }
      else {
        local_c.super_QFlagsStorage<Qt::ItemFlag>.i =
             (QFlagsStorage<Qt::ItemFlag>)QAbstractTableModel::flags(in_RDI);
      }
    }
  }
  else {
    local_c.super_QFlagsStorage<Qt::ItemFlag>.i =
         (QFlagsStorage<Qt::ItemFlag>)QAbstractTableModel::flags(in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QFlagsStorageHelper<Qt::ItemFlag,_4>)
           (QFlagsStorageHelper<Qt::ItemFlag,_4>)local_c.super_QFlagsStorage<Qt::ItemFlag>.i;
  }
  __stack_chk_fail();
}

Assistant:

Qt::ItemFlags QCalendarModel::flags(const QModelIndex &index) const
{
    QDate date = dateForCell(index.row(), index.column());
    if (!date.isValid())
        return QAbstractTableModel::flags(index);
    if (date < m_minimumDate)
        return { };
    if (date > m_maximumDate)
        return { };
    return QAbstractTableModel::flags(index);
}